

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

bool deqp::gles31::Functional::anon_unknown_1::verifyTextureLevelParameterGreaterOrEqual
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int refValue,QueryType type)

{
  ostringstream *this;
  TestLog *log;
  bool bVar1;
  qpTestResult qVar2;
  QueriedState state;
  ResultCollector result;
  Enum<int,_2UL> local_238;
  QueriedState local_228;
  ResultCollector local_200;
  undefined1 local_1b0 [384];
  
  deqp::gls::StateQueryUtil::QueriedState::QueriedState(&local_228);
  log = gl->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b0," // ERROR: ",(allocator<char> *)&local_238);
  tcu::ResultCollector::ResultCollector(&local_200,log,(string *)local_1b0);
  std::__cxx11::string::~string((string *)local_1b0);
  local_1b0._0_8_ = gl->m_log;
  this = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"Verifying ");
  local_238.m_getName = glu::getTextureLevelParameterName;
  local_238.m_value = pname;
  tcu::Format::Enum<int,_2UL>::toStream(&local_238,(ostream *)this);
  std::operator<<((ostream *)this,", expecting ");
  std::ostream::operator<<(this,refValue);
  std::operator<<((ostream *)this," or greater");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  deqp::gls::StateQueryUtil::queryTextureLevelState
            (&local_200,gl,type,target,level,pname,&local_228);
  bVar1 = deqp::gls::StateQueryUtil::QueriedState::isUndefined(&local_228);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    deqp::gls::StateQueryUtil::verifyIntegerMin(&local_200,&local_228,refValue);
    qVar2 = tcu::ResultCollector::getResult(&local_200);
    bVar1 = qVar2 == QP_TEST_RESULT_PASS;
  }
  tcu::ResultCollector::~ResultCollector(&local_200);
  return bVar1;
}

Assistant:

static bool verifyTextureLevelParameterGreaterOrEqual (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, int refValue, QueryType type)
{
	QueriedState			state;
	tcu::ResultCollector	result	(gl.getLog(), " // ERROR: ");

	gl.getLog() << tcu::TestLog::Message << "Verifying " << glu::getTextureLevelParameterStr(pname) << ", expecting " << refValue << " or greater" << tcu::TestLog::EndMessage;
	queryTextureLevelState(result, gl, type, target, level, pname, state);

	if (state.isUndefined())
		return false;

	verifyIntegerMin(result, state, refValue);

	return result.getResult() == QP_TEST_RESULT_PASS;
}